

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  deferred_queue *this_00;
  event_set *this_01;
  __atomic_flag_data_type _Var1;
  test_fsm_observer *ptVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_t count;
  size_t sVar6;
  _Self __tmp;
  size_t in_R9;
  iterator next;
  iterator __position;
  iterator __offout;
  iterator next_1;
  _List_node_base *p_Var7;
  _List_node_base *__offout_00;
  deferred_queue deferred;
  event_set event_ids;
  uint in_stack_ffffffffffffff58;
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  local_90;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *local_78;
  event_set *local_70;
  event_set *local_68;
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  local_60;
  
  LOCK();
  _Var1 = (this->deferred_top_).super___atomic_flag_base._M_i;
  (this->deferred_top_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    local_90._M_impl._M_node._M_size = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
    local_90._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_90;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = skip_deferred_queue(this);
    if (bVar3) {
      ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ptVar2 != (test_fsm_observer *)0x0) {
        test::test_fsm_observer::
        skip_processing_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (ptVar2,this);
      }
    }
    else {
      std::__detail::_List_node_base::swap
                ((_List_node_base *)&this->deferred_events_,(_List_node_base *)&local_90);
      sVar6 = (this->deferred_events_).
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
              ._M_impl._M_node._M_size;
      (this->deferred_events_).
      super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
      ._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size;
      local_90._M_impl._M_node._M_size = sVar6;
      std::
      _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
      ::swap(&(this->deferred_event_ids_)._M_t,&local_60);
    }
    if (local_90._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_90) {
      local_68 = &this->handled_;
      local_70 = &this->deferred_;
      this_00 = &this->deferred_events_;
      this_01 = &this->deferred_event_ids_;
      local_78 = this;
      do {
        ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                 super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (ptVar2 != (test_fsm_observer *)0x0) {
          test::test_fsm_observer::
          start_process_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                    (ptVar2,this,local_90._M_impl._M_node._M_size);
        }
        iVar4 = 0;
        __offout._M_node = local_90._M_impl._M_node.super__List_node_base._M_next;
        do {
          __position._M_node = __offout._M_node;
          p_Var7 = local_90._M_impl._M_node.super__List_node_base._M_next;
          if (__position._M_node == (_List_node_base *)&local_90) break;
          p_Var7 = __position._M_node + 3;
          sVar5 = std::
                  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                  ::count(local_68,(key_type *)p_Var7);
          if (sVar5 == 0) {
            sVar5 = std::
                    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                    ::count(local_70,(key_type *)p_Var7);
            if (sVar5 == 0) {
              __offout._M_node = (__position._M_node)->_M_next;
              std::__cxx11::
              list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
              ::_M_erase((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                          *)&local_90,__position);
              ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                       super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (ptVar2 != (test_fsm_observer *)0x0) {
                test::test_fsm_observer::
                drop_deferred_event<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                          (ptVar2,this);
              }
            }
            else {
              sVar6 = 0;
              __offout._M_node = __position._M_node;
              do {
                if (__offout._M_node[3]._M_next != p_Var7->_M_next) break;
                __offout._M_node = (__offout._M_node)->_M_next;
                sVar6 = sVar6 + 1;
              } while (__offout._M_node != (_List_node_base *)&local_90);
              std::__cxx11::
              list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
              ::splice(this_00,(int)this_00,(__off64_t *)&local_90,(int)__position._M_node,
                       (__off64_t *)__offout._M_node,in_R9,in_stack_ffffffffffffff58);
              std::
              _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              ::_M_insert_unique<afsm::detail::event_base::id_type_const*const&>
                        ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
                          *)this_01,(id_type **)p_Var7);
              this = local_78;
              ptVar2 = (local_78->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                       super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (ptVar2 != (test_fsm_observer *)0x0) {
                test::test_fsm_observer::
                postpone_deferred_events<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                          (ptVar2,local_78,sVar6);
              }
            }
          }
          else {
            if (__position._M_node[2]._M_next == (_List_node_base *)0x0) {
              std::__throw_bad_function_call();
            }
            iVar4 = (*(code *)__position._M_node[2]._M_prev)(__position._M_node + 1);
            __offout._M_node = (__position._M_node)->_M_next;
            std::__cxx11::
            list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ::_M_erase((list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                        *)&local_90,__position);
          }
          p_Var7 = local_90._M_impl._M_node.super__List_node_base._M_next;
        } while (iVar4 != 3);
        while (p_Var7 != (_List_node_base *)&local_90) {
          sVar6 = 0;
          __offout_00 = p_Var7;
          do {
            if (__offout_00[3]._M_next != p_Var7[3]._M_next) break;
            sVar6 = sVar6 + 1;
            __offout_00 = __offout_00->_M_next;
          } while (__offout_00 != (_List_node_base *)&local_90);
          std::__cxx11::
          list<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
          ::splice(this_00,(int)this_00,(__off64_t *)&local_90,(int)p_Var7,(__off64_t *)__offout_00,
                   in_R9,in_stack_ffffffffffffff58);
          std::
          _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
          ::_M_insert_unique<afsm::detail::event_base::id_type_const*const&>
                    ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
                      *)this_01,(id_type **)(p_Var7 + 3));
          ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                   super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var7 = __offout_00;
          if (ptVar2 != (test_fsm_observer *)0x0) {
            test::test_fsm_observer::
            postpone_deferred_events<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                      (ptVar2,this,sVar6);
          }
        }
        std::
        _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
        ::clear(&local_60);
        ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                 super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (ptVar2 != (test_fsm_observer *)0x0) {
          test::test_fsm_observer::
          end_process_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                    (ptVar2,this,
                     (this->deferred_events_).
                     super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                     ._M_impl._M_node._M_size);
        }
        if (__position._M_node != (_List_node_base *)&local_90) {
          bVar3 = skip_deferred_queue(this);
          if (bVar3) {
            ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
                     super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (ptVar2 != (test_fsm_observer *)0x0) {
              test::test_fsm_observer::
              skip_processing_deferred_queue<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                        (ptVar2,this);
            }
          }
          else {
            std::__detail::_List_node_base::swap
                      ((_List_node_base *)this_00,(_List_node_base *)&local_90);
            sVar6 = (this->deferred_events_).
                    super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
                    ._M_impl._M_node._M_size;
            (this->deferred_events_).
            super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size;
            local_90._M_impl._M_node._M_size = sVar6;
            std::
            _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
            ::swap(&this_01->_M_t,&local_60);
          }
        }
      } while (local_90._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&local_90);
    }
    LOCK();
    (this->deferred_top_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::
    _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
    ::_M_clear(&local_90);
  }
  return;
}

Assistant:

void
    process_deferred_queue()
    {
        if (!deferred_top_.test_and_set()) {
            using actions::event_process_result;
            deferred_queue deferred;
            detail::event_set event_ids;
            if (skip_deferred_queue()) {
                observer_wrapper::skip_processing_deferred_queue(*this);
            } else {
                ::std::swap(deferred_events_, deferred);
                ::std::swap(deferred_event_ids_, event_ids);
            }
            while (!deferred.empty()) {
                observer_wrapper::start_process_deferred_queue(*this, deferred.size());
                auto res = event_process_result::refuse;
                for (auto event = deferred.begin(); event != deferred.end();) {
                    if (handled_.count(event->second)) {
                        res = event->first();
                        deferred.erase(event++);
                    } else if (deferred_.count(event->second)) {
                        // Move directly to the deferred queue
                        ::std::size_t count{0};
                        auto next = event;
                        while (next != deferred.end() && next->second == event->second) {
                            ++next;
                            ++count;
                        }
                        deferred_events_.splice(deferred_events_.end(),
                            deferred, event, next);
                        deferred_event_ids_.insert(event->second);
                        event = next;
                        observer_wrapper::postpone_deferred_events(*this, count);
                    } else {
                        deferred.erase(event++);
                        observer_wrapper::drop_deferred_event(*this);
                    }
                    if (res == event_process_result::process)
                        break;
                }
                for (auto event = deferred.begin(); event != deferred.end();) {
                    ::std::size_t count{0};
                    auto next = event;
                    while (next != deferred.end() && next->second == event->second) {
                        ++count;
                        ++next;
                    }
                    deferred_events_.splice(deferred_events_.end(),
                        deferred, event, next);
                    deferred_event_ids_.insert(event->second);
                    event = next;
                    observer_wrapper::postpone_deferred_events(*this, count);
                }
                event_ids.clear();
                observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
                if (res == event_process_result::process) {
                    if (skip_deferred_queue()) {
                        observer_wrapper::skip_processing_deferred_queue(*this);
                    } else {
                        ::std::swap(deferred_events_, deferred);
                        ::std::swap(deferred_event_ids_, event_ids);
                    }
                }
            }
            deferred_top_.clear();
        }
    }